

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::
SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_and_fixing_Test::TestBody
          (SubjectFactoryTest_test_setting_ndf_with_Tenor_and_settlement_and_fixing_Test *this)

{
  string *psVar1;
  Tenor *pTVar2;
  Date *pDVar3;
  Date *pDVar4;
  undefined8 *puVar5;
  char *message;
  allocator<char> local_12b;
  allocator<char> local_12a;
  allocator<char> local_129;
  AssertionResult gtest_ar;
  AssertHelper local_118 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  undefined8 local_80;
  SubjectFactory subject_factory;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70 [8];
  string local_30 [32];
  
  bidfx_public_api::price::subject::SubjectFactory::SubjectFactory(&subject_factory,USER_INFO);
  bidfx_public_api::price::subject::SubjectFactory::Fx();
  local_80 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
  bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Ndf();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"CSFX",&local_129);
  psVar1 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider
                     (local_30);
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"EURGBP",&local_12a);
  psVar1 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar1);
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"EUR",&local_12b);
  bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar1);
  pTVar2 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity
                              (1000000.0);
  pDVar3 = (Date *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar2);
  pDVar4 = (Date *)operator_new(0xc);
  bidfx_public_api::tools::Date::Date(pDVar4,0x7e3,9,0x17);
  pDVar3 = (Date *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::SettlementDate
                             (pDVar3);
  pDVar4 = (Date *)operator_new(0xc);
  bidfx_public_api::tools::Date::Date(pDVar4,0x7e3,9,0x15);
  puVar5 = (undefined8 *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::FixingDate(pDVar3);
  (**(code **)*puVar5)(&local_f8,puVar5);
  bidfx_public_api::price::subject::Subject::ToString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,
             "\"AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=NDF,FixingDate=20190921,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,SettlementDate=20190923,Symbol=EURGBP,Tenor=1Y,User=fbennett\""
             ,
             "subject_factory.Fx().Stream().Ndf() .LiquidityProvider(\"CSFX\") .CurrencyPair(\"EURGBP\") .Currency(\"EUR\") .Quantity(1000000) .Tenor(Tenor::IN_1_YEAR) .SettlementDate(new Date(2019, 9, 23)) .FixingDate(new Date(2019, 9, 21)) .CreateSubject() .ToString().c_str()"
             ,
             "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=NDF,FixingDate=20190921,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,SettlementDate=20190923,Symbol=EURGBP,Tenor=1Y,User=fbennett"
             ,(char *)local_118[0].data_);
  std::__cxx11::string::~string((string *)local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_a0);
  SubjectFactory::MandatoryFieldsSubjectCreator::~MandatoryFieldsSubjectCreator
            ((MandatoryFieldsSubjectCreator *)local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_factory_test.cpp"
               ,0x2a1,message);
    testing::internal::AssertHelper::operator=(local_118,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper(local_118);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_ndf_with_Tenor_and_settlement_and_fixing)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=NDF,FixingDate=20190921,Level=1,LiquidityProvider=CSFX,Quantity=1000000.00,RequestFor=Stream,SettlementDate=20190923,Symbol=EURGBP,Tenor=1Y,User=fbennett",
            subject_factory.Fx().Stream().Ndf()
                    .LiquidityProvider("CSFX")
                    .CurrencyPair("EURGBP")
                    .Currency("EUR")
                    .Quantity(1000000)
                    .Tenor(Tenor::IN_1_YEAR)
                    .SettlementDate(new Date(2019, 9, 23))
                    .FixingDate(new Date(2019, 9, 21))
                    .CreateSubject()
                    .ToString().c_str());
}